

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

robj * duckdb_hll::hll_merge(robj **hlls,size_t hll_count)

{
  uint8_t count;
  char cVar1;
  bool bVar2;
  int iVar3;
  robj *prVar4;
  size_t sVar5;
  long index;
  uint8_t max [4096];
  
  switchD_014c69ad::default(max,0,0x1000);
  bVar2 = false;
  for (sVar5 = 0; hll_count != sVar5; sVar5 = sVar5 + 1) {
    prVar4 = hlls[sVar5];
    if (prVar4 != (robj *)0x0) {
      if (*(char *)((long)prVar4->ptr + 4) == '\0') {
        bVar2 = true;
      }
      iVar3 = hllMerge(max,prVar4);
      if (iVar3 == -1) goto LAB_01eeb19c;
    }
  }
  prVar4 = hll_create();
  if (prVar4 == (robj *)0x0) {
LAB_01eeb19c:
    prVar4 = (robj *)0x0;
  }
  else {
    if (bVar2) {
      iVar3 = hllSparseToDense(prVar4);
      if (iVar3 == -1) {
        hll_destroy(prVar4);
        goto LAB_01eeb19c;
      }
    }
    for (index = 0; index != 0x1000; index = index + 1) {
      count = max[index];
      if (count != '\0') {
        cVar1 = *(char *)((long)prVar4->ptr + 4);
        if (cVar1 == '\x01') {
          hllSparseSet(prVar4,index,count);
        }
        else if (cVar1 == '\0') {
          hllDenseSet((uint8_t *)((long)prVar4->ptr + 0x11),index,count);
        }
      }
    }
  }
  return prVar4;
}

Assistant:

robj *hll_merge(robj **hlls, size_t hll_count) {
    uint8_t max[HLL_REGISTERS];
    struct hllhdr *hdr;
    size_t j;
	 /* Use dense representation as target? */
    int use_dense = 0;

    /* Compute an HLL with M[i] = MAX(M[i]_j).
     * We store the maximum into the max array of registers. We'll write
     * it to the target variable later. */
    memset(max, 0, sizeof(max));
    for (j = 0; j < hll_count; j++) {
        /* Check type and size. */
        robj *o = hlls[j];
        if (o == NULL) continue; /* Assume empty HLL for non existing var. */

        /* If at least one involved HLL is dense, use the dense representation
         * as target ASAP to save time and avoid the conversion step. */
        hdr = (struct hllhdr *) o->ptr;
        if (hdr->encoding == HLL_DENSE) use_dense = 1;

        /* Merge with this HLL with our 'max' HHL by setting max[i]
         * to MAX(max[i],hll[i]). */
        if (hllMerge(max, o) == HLL_C_ERR) {
            return NULL;
        }
    }

    /* Create the destination key's value. */
    robj *result = hll_create();
	if (!result) {
		return NULL;
	}

    /* Convert the destination object to dense representation if at least
     * one of the inputs was dense. */
    if (use_dense && hllSparseToDense(result) == HLL_C_ERR) {
		hll_destroy(result);
        return NULL;
    }

    /* Write the resulting HLL to the destination HLL registers and
     * invalidate the cached value. */
    for (j = 0; j < HLL_REGISTERS; j++) {
        if (max[j] == 0) continue;
        hdr = (struct hllhdr *) result->ptr;
        switch(hdr->encoding) {
        case HLL_DENSE: hllDenseSet(hdr->registers + 1,j,max[j]); break;
        case HLL_SPARSE: hllSparseSet(result,j,max[j]); break;
        }
    }
	return result;
}